

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O0

CommandLineFlagParser * __thiscall
google::anon_unknown_1::CommandLineFlagParser::ProcessOptionsFromStringLocked
          (CommandLineFlagParser *this,string *contentdata,FlagSettingMode set_mode)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  long lVar6;
  size_t sVar7;
  char *pcVar8;
  bool bVar9;
  ulong local_158;
  allocator local_129;
  string local_128 [8];
  string glob;
  char *local_108;
  char *word;
  char *space;
  CommandLineFlag *local_d8;
  CommandLineFlag *flag;
  string error_message;
  char *local_b0;
  char *value;
  string key;
  char *local_88;
  char *name_and_val;
  allocator local_69;
  string local_68 [8];
  string line;
  size_t len;
  char *line_end;
  bool in_filename_section;
  char *pcStack_30;
  bool flags_are_relevant;
  char *flagfile_contents;
  FlagSettingMode set_mode_local;
  string *contentdata_local;
  CommandLineFlagParser *this_local;
  string *retval;
  
  std::__cxx11::string::string((string *)this);
  len = std::__cxx11::string::c_str();
  bVar1 = true;
  bVar2 = false;
  pcStack_30 = (char *)len;
  do {
    if (len == 0) {
      return this;
    }
    while( true ) {
      bVar9 = false;
      if (*pcStack_30 != '\0') {
        iVar3 = isspace((int)*pcStack_30);
        bVar9 = iVar3 != 0;
      }
      if (!bVar9) break;
      pcStack_30 = pcStack_30 + 1;
    }
    len = (size_t)strchr(pcStack_30,10);
    if ((char *)len == (char *)0x0) {
      local_158 = strlen(pcStack_30);
    }
    else {
      local_158 = len - (long)pcStack_30;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,pcStack_30,local_158,&local_69);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    uVar4 = std::__cxx11::string::empty();
    if (((uVar4 & 1) == 0) &&
       (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_68), *pcVar5 != '#')) {
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_68);
      if (*pcVar5 == '-') {
        bVar2 = false;
        if (bVar1) {
          lVar6 = std::__cxx11::string::c_str();
          local_88 = (char *)(lVar6 + 1);
          if (*local_88 == '-') {
            local_88 = (char *)(lVar6 + 2);
          }
          std::__cxx11::string::string((string *)&value);
          std::__cxx11::string::string((string *)&flag);
          local_d8 = FlagRegistry::SplitArgumentLocked
                               (*(FlagRegistry **)contentdata,local_88,(string *)&value,&local_b0,
                                (string *)&flag);
          if ((local_d8 != (CommandLineFlag *)0x0) && (local_b0 != (char *)0x0)) {
            (anonymous_namespace)::CommandLineFlagParser::ProcessSingleOptionLocked_abi_cxx11_
                      ((CommandLineFlagParser *)&space,(CommandLineFlag *)contentdata,
                       (char *)local_d8,(FlagSettingMode)local_b0);
            std::__cxx11::string::operator+=((string *)this,(string *)&space);
            std::__cxx11::string::~string((string *)&space);
          }
          std::__cxx11::string::~string((string *)&flag);
          std::__cxx11::string::~string((string *)&value);
        }
      }
      else {
        if (!bVar2) {
          bVar2 = true;
          bVar1 = false;
        }
        word = (char *)std::__cxx11::string::c_str();
        local_108 = (char *)std::__cxx11::string::c_str();
        while ((*word != '\0' && (!bVar1))) {
          word = strchr(local_108,0x20);
          if (word == (char *)0x0) {
            sVar7 = strlen(local_108);
            word = local_108 + sVar7;
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_128,local_108,(long)word - (long)local_108,&local_129);
          std::allocator<char>::~allocator((allocator<char> *)&local_129);
          pcVar5 = ProgramInvocationName();
          bVar9 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_128,pcVar5);
          if (bVar9) {
LAB_0028341a:
            bVar1 = true;
          }
          else {
            pcVar5 = ProgramInvocationShortName();
            bVar9 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_128,pcVar5);
            if (bVar9) goto LAB_0028341a;
            pcVar5 = (char *)std::__cxx11::string::c_str();
            pcVar8 = ProgramInvocationName();
            iVar3 = fnmatch(pcVar5,pcVar8,1);
            if (iVar3 == 0) goto LAB_0028341a;
            pcVar5 = (char *)std::__cxx11::string::c_str();
            pcVar8 = ProgramInvocationShortName();
            iVar3 = fnmatch(pcVar5,pcVar8,1);
            if (iVar3 == 0) goto LAB_0028341a;
          }
          std::__cxx11::string::~string(local_128);
          local_108 = word + 1;
        }
      }
    }
    std::__cxx11::string::~string(local_68);
    pcStack_30 = (char *)(len + 1);
  } while( true );
}

Assistant:

string CommandLineFlagParser::ProcessOptionsFromStringLocked(
    const string& contentdata, FlagSettingMode set_mode) {
  string retval;
  const char* flagfile_contents = contentdata.c_str();
  bool flags_are_relevant = true;   // set to false when filenames don't match
  bool in_filename_section = false;

  const char* line_end = flagfile_contents;
  // We read this file a line at a time.
  for (; line_end; flagfile_contents = line_end + 1) {
    while (*flagfile_contents && isspace(*flagfile_contents))
      ++flagfile_contents;
    line_end = strchr(flagfile_contents, '\n');
    size_t len = line_end ? line_end - flagfile_contents
                          : strlen(flagfile_contents);
    string line(flagfile_contents, len);

    // Each line can be one of four things:
    // 1) A comment line -- we skip it
    // 2) An empty line -- we skip it
    // 3) A list of filenames -- starts a new filenames+flags section
    // 4) A --flag=value line -- apply if previous filenames match
    if (line.empty() || line[0] == '#') {
      // comment or empty line; just ignore

    } else if (line[0] == '-') {    // flag
      in_filename_section = false;  // instead, it was a flag-line
      if (!flags_are_relevant)      // skip this flag; applies to someone else
        continue;

      const char* name_and_val = line.c_str() + 1;    // skip the leading -
      if (*name_and_val == '-')
        name_and_val++;                               // skip second - too
      string key;
      const char* value;
      string error_message;
      CommandLineFlag* flag = registry_->SplitArgumentLocked(name_and_val,
                                                             &key, &value,
                                                             &error_message);
      // By API, errors parsing flagfile lines are silently ignored.
      if (flag == NULL) {
        // "WARNING: flagname '" + key + "' not found\n"
      } else if (value == NULL) {
        // "WARNING: flagname '" + key + "' missing a value\n"
      } else {
        retval += ProcessSingleOptionLocked(flag, value, set_mode);
      }

    } else {                        // a filename!
      if (!in_filename_section) {   // start over: assume filenames don't match
        in_filename_section = true;
        flags_are_relevant = false;
      }

      // Split the line up at spaces into glob-patterns
      const char* space = line.c_str();   // just has to be non-NULL
      for (const char* word = line.c_str(); *space; word = space+1) {
        if (flags_are_relevant)     // we can stop as soon as we match
          break;
        space = strchr(word, ' ');
        if (space == NULL)
          space = word + strlen(word);
        const string glob(word, space - word);
        // We try matching both against the full argv0 and basename(argv0)
        if (glob == ProgramInvocationName()       // small optimization
            || glob == ProgramInvocationShortName()
#if defined(HAVE_FNMATCH_H)
            || fnmatch(glob.c_str(), ProgramInvocationName(),      FNM_PATHNAME) == 0
            || fnmatch(glob.c_str(), ProgramInvocationShortName(), FNM_PATHNAME) == 0
#elif defined(HAVE_SHLWAPI_H)
            || PathMatchSpec(glob.c_str(), ProgramInvocationName())
            || PathMatchSpec(glob.c_str(), ProgramInvocationShortName())
#endif
            ) {
          flags_are_relevant = true;
        }
      }
    }
  }
  return retval;
}